

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3MatchEName(ExprList_item *pItem,char *zCol,char *zTab,char *zDb)

{
  char *pcVar1;
  int iVar2;
  char *zLeft;
  long lVar3;
  
  if ((*(ushort *)&(pItem->fg).field_0x1 & 3) != 2) {
    return 0;
  }
  lVar3 = 0;
  pcVar1 = pItem->zEName;
  while( true ) {
    if ((*pcVar1 == '\0') || (*pcVar1 == '.')) break;
    lVar3 = lVar3 + 1;
    pcVar1 = pcVar1 + 1;
  }
  if (zDb != (char *)0x0) {
    iVar2 = sqlite3_strnicmp(pItem->zEName,zDb,(int)lVar3);
    if (iVar2 != 0) {
      return 0;
    }
    if (zDb[lVar3] != '\0') {
      return 0;
    }
  }
  lVar3 = 0;
  for (zLeft = pcVar1 + 2; (zLeft[-1] != '\0' && (zLeft[-1] != '.')); zLeft = zLeft + 1) {
    lVar3 = lVar3 + 1;
  }
  if (zTab != (char *)0x0) {
    iVar2 = sqlite3_strnicmp(pcVar1 + 1,zTab,(int)lVar3);
    if (iVar2 != 0) {
      return 0;
    }
    if (zTab[lVar3] != '\0') {
      return 0;
    }
  }
  if ((zCol != (char *)0x0) && (iVar2 = sqlite3StrICmp(zLeft,zCol), iVar2 != 0)) {
    return 0;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchEName(
  const struct ExprList_item *pItem,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  const char *zSpan;
  if( pItem->fg.eEName!=ENAME_TAB ) return 0;
  zSpan = pItem->zEName;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}